

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptorProto::ServiceDescriptorProto
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  Rep *pRVar1;
  void *pvVar2;
  ServiceOptions *from_00;
  void **our_elems;
  ServiceOptions *this_00;
  int iVar3;
  Arena *arena;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ServiceDescriptorProto_00680b00;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->method_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->method_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->method_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->method_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar3 = (from->method_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    pRVar1 = (from->method_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->method_).super_RepeatedPtrFieldBase,iVar3);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
              (&(this->method_).super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar3,
               ((this->method_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->method_).super_RepeatedPtrFieldBase.current_size_);
    iVar3 = iVar3 + (this->method_).super_RepeatedPtrFieldBase.current_size_;
    (this->method_).super_RepeatedPtrFieldBase.current_size_ = iVar3;
    pRVar1 = (this->method_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar3) {
      pRVar1->allocated_size = iVar3;
    }
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    arena = (Arena *)(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->name_,arena,(from->name_).ptr_);
  }
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    this_00 = (ServiceOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_00 = (ServiceOptions *)operator_new(0x50);
    ServiceOptions::ServiceOptions(this_00,from_00);
  }
  this->options_ = this_00;
  return;
}

Assistant:

ServiceDescriptorProto::ServiceDescriptorProto(const ServiceDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      method_(from.method_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::ServiceOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.ServiceDescriptorProto)
}